

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathMatrix3.cpp
# Opt level: O2

void COLLADABU::Math::Matrix3::golubKahanStep(Matrix3 *kA,Matrix3 *kL,Matrix3 *kR)

{
  double *pdVar1;
  long lVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar7 = kA->m[1][1];
  dVar8 = kA->m[1][2];
  dVar5 = kA->m[2][2];
  dVar4 = kA->m[0][1];
  dVar4 = dVar4 * dVar4 + dVar7 * dVar7;
  dVar6 = dVar8 * dVar8 + dVar5 * dVar5;
  dVar9 = dVar4 + dVar6;
  dVar4 = dVar4 - dVar6;
  dVar5 = dVar4 * dVar4 + dVar8 * dVar7 * 4.0 * dVar8 * dVar7;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  dVar7 = (dVar5 + dVar9) * 0.5;
  dVar8 = (dVar9 - dVar5) * 0.5;
  uVar3 = -(ulong)(ABS(dVar7 - dVar6) <= ABS(dVar8 - dVar6));
  dVar5 = kA->m[0][0];
  dVar4 = kA->m[0][1];
  dVar7 = dVar5 - (double)(~uVar3 & (ulong)dVar8 | uVar3 & (ulong)dVar7);
  dVar8 = 1.0 / SQRT(dVar7 * dVar7 + dVar4 * dVar4);
  dVar7 = -dVar7 * dVar8;
  dVar8 = dVar4 * dVar8;
  dVar6 = -dVar8;
  kA->m[0][0] = dVar5 * dVar7 + dVar4 * dVar6;
  kA->m[0][1] = dVar5 * dVar8 + dVar4 * dVar7;
  dVar5 = kA->m[1][1];
  kA->m[1][0] = dVar5 * dVar6;
  kA->m[1][1] = dVar5 * dVar7;
  for (lVar2 = -0x18; lVar2 != 0; lVar2 = lVar2 + 8) {
    dVar5 = *(double *)((long)kR->m[1] + lVar2);
    dVar4 = *(double *)((long)kR->m[2] + lVar2);
    *(double *)((long)kR->m[1] + lVar2) = dVar7 * dVar5 + dVar4 * dVar6;
    *(double *)((long)kR->m[2] + lVar2) = dVar5 * dVar8 + dVar4 * dVar7;
  }
  dVar5 = kA->m[0][0];
  dVar8 = kA->m[0][1];
  dVar6 = kA->m[1][0];
  dVar9 = kA->m[1][1];
  dVar7 = 1.0 / SQRT(dVar5 * dVar5 + dVar6 * dVar6);
  dVar4 = -dVar5 * dVar7;
  dVar7 = dVar6 * dVar7;
  kA->m[0][0] = dVar4 * dVar5 - dVar6 * dVar7;
  kA->m[0][1] = dVar4 * dVar8 - dVar9 * dVar7;
  kA->m[1][1] = dVar8 * dVar7 + dVar9 * dVar4;
  dVar5 = kA->m[1][2];
  kA->m[0][2] = dVar5 * -dVar7;
  kA->m[1][2] = dVar5 * dVar4;
  for (lVar2 = 0; lVar2 != 0x48; lVar2 = lVar2 + 0x18) {
    dVar5 = *(double *)((long)kL->m[0] + lVar2);
    dVar8 = *(double *)((long)kL->m[0] + lVar2 + 8);
    pdVar1 = (double *)((long)kL->m[0] + lVar2);
    *pdVar1 = dVar5 * dVar4 + dVar8 * -dVar7;
    pdVar1[1] = dVar5 * dVar7 + dVar8 * dVar4;
  }
  dVar5 = kA->m[0][1];
  dVar4 = kA->m[0][2];
  dVar8 = 1.0 / SQRT(dVar5 * dVar5 + dVar4 * dVar4);
  dVar6 = kA->m[1][1];
  dVar9 = kA->m[1][2];
  dVar7 = -dVar5 * dVar8;
  dVar8 = dVar4 * dVar8;
  dVar10 = -dVar8;
  kA->m[0][1] = dVar5 * dVar7 - dVar4 * dVar8;
  kA->m[1][1] = dVar6 * dVar7 + dVar9 * dVar10;
  kA->m[1][2] = dVar6 * dVar8 + dVar9 * dVar7;
  dVar5 = kA->m[2][2];
  kA->m[2][1] = dVar5 * dVar10;
  kA->m[2][2] = dVar5 * dVar7;
  for (lVar2 = -0x18; lVar2 != 0; lVar2 = lVar2 + 8) {
    dVar5 = *(double *)((long)kR->m[2] + lVar2);
    dVar4 = *(double *)((long)kR[1].m[0] + lVar2);
    *(double *)((long)kR->m[2] + lVar2) = dVar7 * dVar5 + dVar4 * dVar10;
    *(double *)((long)kR[1].m[0] + lVar2) = dVar5 * dVar8 + dVar4 * dVar7;
  }
  dVar7 = kA->m[1][1];
  dVar8 = kA->m[1][2];
  dVar6 = kA->m[2][1];
  dVar9 = kA->m[2][2];
  dVar4 = 1.0 / SQRT(dVar7 * dVar7 + dVar6 * dVar6);
  dVar5 = -dVar7 * dVar4;
  dVar4 = dVar6 * dVar4;
  kA->m[1][1] = dVar5 * dVar7 - dVar6 * dVar4;
  kA->m[1][2] = dVar5 * dVar8 - dVar9 * dVar4;
  kA->m[2][2] = dVar8 * dVar4 + dVar9 * dVar5;
  for (lVar2 = 0; lVar2 != 0x48; lVar2 = lVar2 + 0x18) {
    dVar7 = *(double *)((long)kL->m[0] + lVar2 + 8);
    dVar8 = *(double *)((long)kL->m[0] + lVar2 + 0x10);
    pdVar1 = (double *)((long)kL->m[0] + lVar2 + 8);
    *pdVar1 = dVar7 * dVar5 + dVar8 * -dVar4;
    pdVar1[1] = dVar7 * dVar4 + dVar8 * dVar5;
  }
  return;
}

Assistant:

void Matrix3::golubKahanStep ( Matrix3& kA, Matrix3& kL,
                                       Matrix3& kR )
        {
            Real fT11 = kA[ 0 ][ 1 ] * kA[ 0 ][ 1 ] + kA[ 1 ][ 1 ] * kA[ 1 ][ 1 ];
            Real fT22 = kA[ 1 ][ 2 ] * kA[ 1 ][ 2 ] + kA[ 2 ][ 2 ] * kA[ 2 ][ 2 ];
            Real fT12 = kA[ 1 ][ 1 ] * kA[ 1 ][ 2 ];
            Real fTrace = fT11 + fT22;
            Real fDiff = fT11 - fT22;
            Real fDiscr = sqrt( fDiff * fDiff + 4.0 * fT12 * fT12 );
            Real fRoot1 = 0.5 * ( fTrace + fDiscr );
            Real fRoot2 = 0.5 * ( fTrace - fDiscr );

            // adjust right
            Real fY = kA[ 0 ][ 0 ] - ( std::abs( fRoot1 - fT22 ) <=
                                       std::abs( fRoot2 - fT22 ) ? fRoot1 : fRoot2 );
            Real fZ = kA[ 0 ][ 1 ];
            Real fInvLength = 1/sqrt( fY * fY + fZ * fZ );
            Real fSin = fZ * fInvLength;
            Real fCos = -fY * fInvLength;

            Real fTmp0 = kA[ 0 ][ 0 ];
            Real fTmp1 = kA[ 0 ][ 1 ];
            kA[ 0 ][ 0 ] = fCos * fTmp0 - fSin * fTmp1;
            kA[ 0 ][ 1 ] = fSin * fTmp0 + fCos * fTmp1;
            kA[ 1 ][ 0 ] = -fSin * kA[ 1 ][ 1 ];
            kA[ 1 ][ 1 ] *= fCos;

            size_t iRow;

            for ( iRow = 0; iRow < 3; iRow++ )
            {
                fTmp0 = kR[ 0 ][ iRow ];
                fTmp1 = kR[ 1 ][ iRow ];
                kR[ 0 ][ iRow ] = fCos * fTmp0 - fSin * fTmp1;
                kR[ 1 ][ iRow ] = fSin * fTmp0 + fCos * fTmp1;
            }

            // adjust left
            fY = kA[ 0 ][ 0 ];

            fZ = kA[ 1 ][ 0 ];

            fInvLength = 1/sqrt( fY * fY + fZ * fZ );

            fSin = fZ * fInvLength;

            fCos = -fY * fInvLength;

            kA[ 0 ][ 0 ] = fCos * kA[ 0 ][ 0 ] - fSin * kA[ 1 ][ 0 ];

            fTmp0 = kA[ 0 ][ 1 ];

            fTmp1 = kA[ 1 ][ 1 ];

            kA[ 0 ][ 1 ] = fCos * fTmp0 - fSin * fTmp1;

            kA[ 1 ][ 1 ] = fSin * fTmp0 + fCos * fTmp1;

            kA[ 0 ][ 2 ] = -fSin * kA[ 1 ][ 2 ];

            kA[ 1 ][ 2 ] *= fCos;

            size_t iCol;

            for ( iCol = 0; iCol < 3; iCol++ )
            {
                fTmp0 = kL[ iCol ][ 0 ];
                fTmp1 = kL[ iCol ][ 1 ];
                kL[ iCol ][ 0 ] = fCos * fTmp0 - fSin * fTmp1;
                kL[ iCol ][ 1 ] = fSin * fTmp0 + fCos * fTmp1;
            }

            // adjust right
            fY = kA[ 0 ][ 1 ];

            fZ = kA[ 0 ][ 2 ];

            fInvLength = 1/sqrt( fY * fY + fZ * fZ );

            fSin = fZ * fInvLength;

            fCos = -fY * fInvLength;

            kA[ 0 ][ 1 ] = fCos * kA[ 0 ][ 1 ] - fSin * kA[ 0 ][ 2 ];

            fTmp0 = kA[ 1 ][ 1 ];

            fTmp1 = kA[ 1 ][ 2 ];

            kA[ 1 ][ 1 ] = fCos * fTmp0 - fSin * fTmp1;

            kA[ 1 ][ 2 ] = fSin * fTmp0 + fCos * fTmp1;

            kA[ 2 ][ 1 ] = -fSin * kA[ 2 ][ 2 ];

            kA[ 2 ][ 2 ] *= fCos;

            for ( iRow = 0; iRow < 3; iRow++ )
            {
                fTmp0 = kR[ 1 ][ iRow ];
                fTmp1 = kR[ 2 ][ iRow ];
                kR[ 1 ][ iRow ] = fCos * fTmp0 - fSin * fTmp1;
                kR[ 2 ][ iRow ] = fSin * fTmp0 + fCos * fTmp1;
            }

            // adjust left
            fY = kA[ 1 ][ 1 ];

            fZ = kA[ 2 ][ 1 ];

            fInvLength = 1/sqrt( fY * fY + fZ * fZ );

            fSin = fZ * fInvLength;

            fCos = -fY * fInvLength;

            kA[ 1 ][ 1 ] = fCos * kA[ 1 ][ 1 ] - fSin * kA[ 2 ][ 1 ];

            fTmp0 = kA[ 1 ][ 2 ];

            fTmp1 = kA[ 2 ][ 2 ];

            kA[ 1 ][ 2 ] = fCos * fTmp0 - fSin * fTmp1;

            kA[ 2 ][ 2 ] = fSin * fTmp0 + fCos * fTmp1;

            for ( iCol = 0; iCol < 3; iCol++ )
            {
                fTmp0 = kL[ iCol ][ 1 ];
                fTmp1 = kL[ iCol ][ 2 ];
                kL[ iCol ][ 1 ] = fCos * fTmp0 - fSin * fTmp1;
                kL[ iCol ][ 2 ] = fSin * fTmp0 + fCos * fTmp1;
            }
        }